

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dsa_asn1.cc
# Opt level: O0

int dsa_missing_parameters(EVP_PKEY *pkey)

{
  DSA *dsa_00;
  BIGNUM *pBVar1;
  DSA *dsa;
  EVP_PKEY *pkey_local;
  
  dsa_00 = (DSA *)pkey->pkey;
  pBVar1 = DSA_get0_p(dsa_00);
  if (((pBVar1 != (BIGNUM *)0x0) && (pBVar1 = DSA_get0_q(dsa_00), pBVar1 != (BIGNUM *)0x0)) &&
     (pBVar1 = DSA_get0_g(dsa_00), pBVar1 != (BIGNUM *)0x0)) {
    return 0;
  }
  return 1;
}

Assistant:

static int dsa_missing_parameters(const EVP_PKEY *pkey) {
  const DSA *dsa = reinterpret_cast<const DSA *>(pkey->pkey);
  if (DSA_get0_p(dsa) == nullptr || DSA_get0_q(dsa) == nullptr ||
      DSA_get0_g(dsa) == nullptr) {
    return 1;
  }
  return 0;
}